

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hdr_histogram.c
# Opt level: O1

int64_t hdr_min(hdr_histogram *h)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  long lVar4;
  int64_t iVar5;
  ulong uVar6;
  byte bVar7;
  int iVar8;
  
  iVar1 = h->normalizing_index_offset;
  if (iVar1 == 0) {
    lVar4 = 0;
  }
  else {
    if (iVar1 < 1) {
      iVar2 = h->counts_len;
      iVar8 = 0;
      if (iVar2 == -iVar1 || SBORROW4(iVar2,-iVar1) != iVar2 + iVar1 < 0) {
        iVar8 = -iVar2;
      }
    }
    else {
      iVar8 = h->counts_len;
    }
    lVar4 = (long)(iVar8 - iVar1);
  }
  if (0 < h->counts[lVar4]) {
    return 0;
  }
  iVar5 = 0x7fffffffffffffff;
  uVar3 = h->min_value;
  if (uVar3 != 0x7fffffffffffffff) {
    uVar6 = h->sub_bucket_mask | uVar3;
    lVar4 = 0x3f;
    if (uVar6 != 0) {
      for (; uVar6 >> lVar4 == 0; lVar4 = lVar4 + -1) {
      }
    }
    bVar7 = 0x3f - (((byte)lVar4 ^ 0x3f) + (char)h->sub_bucket_half_count_magnitude);
    iVar5 = (long)(int)((long)uVar3 >> (bVar7 & 0x3f)) << (bVar7 & 0x3f);
  }
  return iVar5;
}

Assistant:

static int32_t normalize_index(const struct hdr_histogram* h, int32_t index)
{
    int32_t normalized_index;
    int32_t adjustment = 0;
    if (h->normalizing_index_offset == 0)
    {
        return index;
    }

    normalized_index = index - h->normalizing_index_offset;

    if (normalized_index < 0)
    {
        adjustment = h->counts_len;
    }
    else if (normalized_index >= h->counts_len)
    {
        adjustment = -h->counts_len;
    }

    return normalized_index + adjustment;
}